

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O0

void do_data(char *infile,char *outfile)

{
  FILE *pFVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  bool bVar6;
  uint local_130;
  int local_12c;
  int line_cnt;
  int entry_cnt;
  long txt_offset;
  char local_118 [7];
  boolean ok;
  char tempfile [256];
  char *outfile_local;
  char *infile_local;
  
  tempfile._248_8_ = outfile;
  sprintf(local_118,"%s.%s",outfile,"tmp");
  ifp = (FILE *)fopen(infile,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
    perror(infile);
    exit(1);
  }
  ofp = (FILE *)fopen((char *)tempfile._248_8_,"w+");
  if ((FILE *)ofp != (FILE *)0x0) {
    tfp = (FILE *)fopen(local_118,"w+");
    if ((FILE *)tfp == (FILE *)0x0) {
      perror(local_118);
      fclose((FILE *)ifp);
      fclose((FILE *)ofp);
      unlink((char *)tempfile._248_8_);
      exit(1);
    }
    fprintf((FILE *)ofp,"%s%08lx\n",Dont_Edit_Data,0);
    local_130 = 0;
    local_12c = 0;
    while (pcVar4 = fgets(in_line,0x100,(FILE *)ifp), pcVar4 != (char *)0x0) {
      bVar2 = d_filter(in_line);
      pFVar1 = ofp;
      if (bVar2 == '\0') {
        if (in_line[0] < '!') {
          if (local_12c != 0) {
            if (local_130 == 0) {
              lVar5 = ftell((FILE *)tfp);
              fprintf((FILE *)pFVar1,"%ld,",lVar5);
            }
            fputs(in_line,(FILE *)tfp);
            local_130 = local_130 + 1;
          }
        }
        else {
          if (local_130 != 0) {
            fprintf((FILE *)ofp,"%d\n",(ulong)local_130);
            local_130 = 0;
          }
          fputs(in_line,(FILE *)ofp);
          local_12c = local_12c + 1;
        }
      }
    }
    if (local_130 != 0) {
      fprintf((FILE *)ofp,"%d\n",(ulong)local_130);
    }
    pFVar1 = ofp;
    lVar5 = ftell((FILE *)tfp);
    fprintf((FILE *)pFVar1,".\n%ld,%d\n",lVar5,0);
    lVar5 = ftell((FILE *)ofp);
    fclose((FILE *)ifp);
    sprintf(in_line,"rewind of \"%s\"",local_118);
    iVar3 = fseek((FILE *)tfp,0,0);
    if (iVar3 == 0) {
      while (pcVar4 = fgets(in_line,0x100,(FILE *)tfp), pcVar4 != (char *)0x0) {
        fputs(in_line,(FILE *)ofp);
      }
      fclose((FILE *)tfp);
      unlink(local_118);
      sprintf(in_line,"rewind of \"%s\"",tempfile._248_8_);
      iVar3 = fseek((FILE *)ofp,0,0);
      bVar6 = iVar3 == 0;
      if (bVar6) {
        sprintf(in_line,"header rewrite of \"%s\"",tempfile._248_8_);
        iVar3 = fprintf((FILE *)ofp,"%s%08lx\n",Dont_Edit_Data,lVar5);
        bVar6 = -1 < iVar3;
      }
      if (bVar6) {
        fclose((FILE *)ofp);
        return;
      }
    }
    perror(in_line);
    fclose((FILE *)ofp);
    unlink((char *)tempfile._248_8_);
    exit(1);
  }
  perror((char *)tempfile._248_8_);
  fclose((FILE *)ifp);
  exit(1);
}

Assistant:

void do_data(const char *infile, const char *outfile)
{
	char	tempfile[256];
	boolean ok;
	long	txt_offset;
	int	entry_cnt, line_cnt;

	sprintf(tempfile, "%s.%s", outfile, "tmp");

	if (!(ifp = fopen(infile, RDTMODE))) {		/* data.base */
		perror(infile);
		exit(EXIT_FAILURE);
	}
	if (!(ofp = fopen(outfile, WRTMODE))) {	/* data */
		perror(outfile);
		fclose(ifp);
		exit(EXIT_FAILURE);
	}
	if (!(tfp = fopen(tempfile, WRTMODE))) {	/* data.tmp */
		perror(tempfile);
		fclose(ifp);
		fclose(ofp);
		unlink(outfile);
		exit(EXIT_FAILURE);
	}

	/* output a dummy header record; we'll rewind and overwrite it later */
	fprintf(ofp, "%s%08lx\n", Dont_Edit_Data, 0L);

	entry_cnt = line_cnt = 0;
	/* read through the input file and split it into two sections */
	while (fgets(in_line, sizeof in_line, ifp)) {
	    if (d_filter(in_line)) continue;
	    if (*in_line > ' ') {	/* got an entry name */
		/* first finish previous entry */
		if (line_cnt)  fprintf(ofp, "%d\n", line_cnt),  line_cnt = 0;
		/* output the entry name */
		fputs(in_line, ofp);
		entry_cnt++;		/* update number of entries */
	    } else if (entry_cnt) {	/* got some descriptive text */
		/* update previous entry with current text offset */
		if (!line_cnt)  fprintf(ofp, "%ld,", ftell(tfp));
		/* save the text line in the scratch file */
		fputs(in_line, tfp);
		line_cnt++;		/* update line counter */
	    }
	}
	/* output an end marker and then record the current position */
	if (line_cnt)  fprintf(ofp, "%d\n", line_cnt);
	fprintf(ofp, ".\n%ld,%d\n", ftell(tfp), 0);
	txt_offset = ftell(ofp);
	fclose(ifp);		/* all done with original input file */

	/* reprocess the scratch file; 1st format an error msg, just in case */
	sprintf(in_line, "rewind of \"%s\"", tempfile);
	if (rewind(tfp) != 0)  goto dead_data;
	/* copy all lines of text from the scratch file into the output file */
	while (fgets(in_line, sizeof in_line, tfp))
	    fputs(in_line, ofp);

	/* finished with scratch file */
	fclose(tfp);
	unlink(tempfile);	/* remove it */

	/* update the first record of the output file; prepare error msg 1st */
	sprintf(in_line, "rewind of \"%s\"", outfile);
	ok = (rewind(ofp) == 0);
	if (ok) {
	   sprintf(in_line, "header rewrite of \"%s\"", outfile);
	   ok = (fprintf(ofp, "%s%08lx\n", Dont_Edit_Data, txt_offset) >= 0);
	}
	if (!ok) {
dead_data:  perror(in_line);	/* report the problem */
	    /* close and kill the aborted output file, then give up */
	    fclose(ofp);
	    unlink(outfile);
	    exit(EXIT_FAILURE);
	}

	/* all done */
	fclose(ofp);

	return;
}